

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3833::ComputeMassMatrixAndGravityForce
          (ChElementShellANCF_3833 *this)

{
  double dVar1;
  double dVar2;
  double thickness;
  double zoffset;
  double dVar3;
  double eta;
  double zeta;
  double dVar4;
  double dVar5;
  double dVar6;
  double xi;
  Scalar SVar7;
  long lVar8;
  Scalar *pSVar9;
  Scalar *pSVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint j;
  long lVar17;
  uint i;
  ulong uVar18;
  long lVar19;
  double dVar20;
  VectorN Sxi_compact;
  ChMatrixNM<double,_NSF,_NSF>_conflict2 MassMatrixCompactSquare;
  double local_13a0;
  double local_1398 [2];
  scalar_constant_op<double> local_1388;
  RhsNested local_1380;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_1,_0,_24,_1>_>,_const_Eigen::Matrix<double,_24,_1,_0,_24,_1>_>
  local_1370;
  __shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> *local_1348;
  __shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> local_1340 [12];
  DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> local_1280 [4688];
  
  Eigen::DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>::setZero(local_1280);
  Eigen::DenseBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_> *)&this->m_GravForceScale);
  for (uVar18 = 0; uVar18 < (ulong)(long)this->m_numLayers; uVar18 = uVar18 + 1) {
    std::__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (local_1340,
               (__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> *)
               ((this->m_layers).
                super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar18));
    dVar1 = (local_1340[0]._M_ptr)->m_rho;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1340[0]._M_refcount);
    dVar2 = this->m_thicknessZ;
    thickness = (this->m_layers).
                super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar18].m_thickness;
    zoffset = (this->m_layer_zoffsets).super__Vector_base<double,_Eigen::aligned_allocator<double>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar18];
    lVar17 = *(long *)(DAT_011df610 + 0x60);
    lVar19 = *(long *)(DAT_011df610 + 0x68);
    dVar3 = this->m_midsurfoffset;
    lVar8 = DAT_011df610;
    for (uVar13 = 0; uVar14 = (ulong)uVar13, uVar14 < (ulong)(lVar19 - lVar17 >> 3);
        uVar13 = uVar13 + 1) {
      for (uVar15 = 0; uVar16 = (ulong)uVar15, uVar16 < (ulong)(lVar19 - lVar17 >> 3);
          uVar15 = uVar15 + 1) {
        uVar11 = 0;
        while( true ) {
          uVar12 = (ulong)uVar11;
          lVar19 = *(long *)(lVar8 + 0x68);
          lVar17 = *(long *)(lVar8 + 0x60);
          if ((ulong)(lVar19 - lVar17 >> 3) <= uVar12) break;
          eta = *(double *)(lVar17 + uVar16 * 8);
          zeta = *(double *)(lVar17 + uVar12 * 8);
          lVar19 = *(long *)(static_tables_3833 + 0x60);
          dVar4 = *(double *)(lVar19 + uVar14 * 8);
          dVar5 = *(double *)(lVar19 + uVar16 * 8);
          dVar6 = *(double *)(lVar19 + uVar12 * 8);
          xi = *(double *)(lVar17 + uVar14 * 8);
          dVar20 = Calc_det_J_0xi(this,xi,eta,zeta,thickness,zoffset);
          Calc_Sxi_compact(this,(VectorN *)local_1340,xi,eta,zeta,thickness,
                           thickness * 0.5 + (zoffset - dVar2 * 0.5) + dVar3);
          dVar20 = dVar20 * dVar4 * dVar5 * dVar6 * dVar1;
          local_1398[0] = dVar20;
          Eigen::operator*(&local_1370,local_1398,(StorageBaseType *)local_1340);
          Eigen::MatrixBase<Eigen::Matrix<double,24,1,0,24,1>>::operator+=
                    ((MatrixBase<Eigen::Matrix<double,24,1,0,24,1>> *)&this->m_GravForceScale,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_1,_0,_24,_1>_>,_const_Eigen::Matrix<double,_24,_1,_0,_24,_1>_>_>
                      *)&local_1370);
          local_13a0 = dVar20;
          Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_1,_0,_24,_1>_>,_const_Eigen::Matrix<double,_24,_1,_0,_24,_1>_>
                            *)local_1398,&local_13a0,(StorageBaseType *)local_1340);
          local_1370.m_lhs.m_functor.m_other = local_1388.m_other;
          local_1370.m_rhs = local_1380;
          local_1348 = local_1340;
          Eigen::MatrixBase<Eigen::Matrix<double,24,24,1,24,24>>::operator+=
                    ((MatrixBase<Eigen::Matrix<double,24,24,1,24,24>> *)local_1280,
                     (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_1,_0,_24,_1>_>,_const_Eigen::Matrix<double,_24,_1,_0,_24,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>,_0>_>
                      *)&local_1370);
          uVar11 = uVar11 + 1;
          lVar8 = DAT_011df610;
        }
      }
    }
  }
  uVar13 = 0;
  for (lVar19 = 0; lVar17 = lVar19, lVar19 != 0x18; lVar19 = lVar19 + 1) {
    for (; lVar17 != 0x18; lVar17 = lVar17 + 1) {
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_1> *)local_1280
                          ,lVar19,lVar17);
      SVar7 = *pSVar9;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>,_1> *)
                           &this->m_MassMatrix,(ulong)uVar13);
      uVar13 = uVar13 + 1;
      *pSVar10 = SVar7;
    }
  }
  return;
}

Assistant:

void ChElementShellANCF_3833::ComputeMassMatrixAndGravityForce() {
    // For this element, the mass matrix integrand is of order 9 in xi, 9 in eta, and 9 in zeta.
    // 5 GQ Points are needed in the xi, eta, and zeta directions for exact integration of the element's mass matrix,
    // even if the reference configuration is not straight. Since the major pieces of the generalized force due to
    // gravity can also be used to calculate the mass matrix, these calculations are performed at the same time.  Only
    // the matrix that scales the acceleration due to gravity is calculated at this time so that any changes to the
    // acceleration due to gravity in the system are correctly accounted for in the generalized internal force
    // calculation.

    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi_eta = 4;  // 5 Point Gauss-Quadrature;
    unsigned int GQ_idx_zeta = 4;    // 5 Point Gauss-Quadrature;

    // Mass Matrix in its compact matrix form.  Since the mass matrix is symmetric, just the upper diagonal entries will
    // be stored.
    ChMatrixNM<double, NSF, NSF> MassMatrixCompactSquare;

    // Set these to zeros since they will be incremented as the vector/matrix is calculated
    MassMatrixCompactSquare.setZero();
    m_GravForceScale.setZero();

    for (size_t kl = 0; kl < m_numLayers; kl++) {
        double rho = m_layers[kl].GetMaterial()->Get_rho();  // Density of the material for the current layer
        double thickness = m_layers[kl].Get_thickness();
        double zoffset = m_layer_zoffsets[kl];
        double layer_midsurface_offset =
            -m_thicknessZ / 2 + m_layer_zoffsets[kl] + m_layers[kl].Get_thickness() / 2 + m_midsurfoffset;

        // Sum the contribution to the mass matrix and generalized force due to gravity at the current point
        for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi_eta].size(); it_xi++) {
            for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_xi_eta].size(); it_eta++) {
                for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_zeta].size(); it_zeta++) {
                    double GQ_weight = GQTable->Weight[GQ_idx_xi_eta][it_xi] * GQTable->Weight[GQ_idx_xi_eta][it_eta] *
                                       GQTable->Weight[GQ_idx_zeta][it_zeta];
                    double xi = GQTable->Lroots[GQ_idx_xi_eta][it_xi];
                    double eta = GQTable->Lroots[GQ_idx_xi_eta][it_eta];
                    double zeta = GQTable->Lroots[GQ_idx_zeta][it_zeta];
                    double det_J_0xi = Calc_det_J_0xi(xi, eta, zeta, thickness,
                                                      zoffset);  // determinant of the element Jacobian (volume ratio)

                    VectorN Sxi_compact;  // Vector of the Unique Normalized Shape Functions
                    Calc_Sxi_compact(Sxi_compact, xi, eta, zeta, thickness, layer_midsurface_offset);

                    m_GravForceScale += (GQ_weight * rho * det_J_0xi) * Sxi_compact;
                    MassMatrixCompactSquare += (GQ_weight * rho * det_J_0xi) * Sxi_compact * Sxi_compact.transpose();
                }
            }
        }
    }

    // Store just the unique entries in the Mass Matrix in Compact Upper Triangular Form
    // since the full Mass Matrix is both sparse and symmetric
    unsigned int idx = 0;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = i; j < NSF; j++) {
            m_MassMatrix(idx) = MassMatrixCompactSquare(i, j);
            idx++;
        }
    }
}